

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O3

void __thiscall
duckdb::NestedLoopJoinLocalScanState::NestedLoopJoinLocalScanState
          (NestedLoopJoinLocalScanState *this,PhysicalNestedLoopJoin *op,
          NestedLoopJoinGlobalScanState *gstate)

{
  (this->super_LocalSourceState)._vptr_LocalSourceState =
       (_func_int **)&PTR__NestedLoopJoinLocalScanState_0245c220;
  DataChunk::DataChunk(&(this->scan_state).scan_chunk);
  (this->scan_state).match_sel.sel_vector = (sel_t *)0x0;
  (this->scan_state).match_sel.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->scan_state).match_sel.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->scan_state).local_scan.current_chunk_state.handles._M_h._M_buckets =
       &(this->scan_state).local_scan.current_chunk_state.handles._M_h._M_single_bucket;
  (this->scan_state).local_scan.current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->scan_state).local_scan.current_chunk_state.handles._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->scan_state).local_scan.current_chunk_state.handles._M_h._M_element_count = 0;
  (this->scan_state).local_scan.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor
       = 1.0;
  (this->scan_state).local_scan.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0
  ;
  (this->scan_state).local_scan.current_chunk_state.handles._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (this->scan_state).local_scan.current_chunk_state.properties = INVALID;
  (this->scan_state).local_scan.current_segment_index = 0xffffffffffffffff;
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
  operator->(&(op->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
              super_PhysicalOperator.sink_state);
  SelectionVector::Initialize(&(this->scan_state).match_sel,0x800);
  ColumnDataCollection::InitializeScanChunk
            ((gstate->scan_state).data,&(this->scan_state).scan_chunk);
  return;
}

Assistant:

explicit NestedLoopJoinLocalScanState(const PhysicalNestedLoopJoin &op, NestedLoopJoinGlobalScanState &gstate) {
		D_ASSERT(op.sink_state);
		auto &sink = op.sink_state->Cast<NestedLoopJoinGlobalState>();
		sink.right_outer.InitializeScan(gstate.scan_state, scan_state);
	}